

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_get_message(Curl_easy *data,bufref *out)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  size_t len;
  char *ptr;
  long lVar5;
  
  pcVar3 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  uVar2 = (data->conn->proto).ftpc.pp.nfinal;
  if (uVar2 < 5) {
    ptr = "";
    len = 0;
  }
  else {
    for (lVar4 = 0; (pcVar3[lVar4 + 4] == '\t' || (pcVar3[lVar4 + 4] == ' ')); lVar4 = lVar4 + 1) {
    }
    ptr = pcVar3 + lVar4 + 4;
    if (uVar2 - 4 == lVar4) {
      len = (uVar2 - lVar4) - 4;
    }
    else {
      lVar5 = 0;
      do {
        if ((0x20 < (ulong)(byte)pcVar3[lVar5 + (uVar2 - 1)]) ||
           ((0x100002600U >> ((ulong)(byte)pcVar3[lVar5 + (uVar2 - 1)] & 0x3f) & 1) == 0)) {
          len = ((uVar2 - lVar4) + lVar5) - 4;
          goto LAB_0015ab07;
        }
        lVar1 = uVar2 + lVar5;
        lVar5 = lVar5 + -1;
      } while (lVar1 + -5 != lVar4);
      len = 0;
    }
LAB_0015ab07:
    pcVar3[lVar4 + 4 + len] = '\0';
  }
  Curl_bufref_set(out,ptr,len,(_func_void_void_ptr *)0x0);
  return CURLE_OK;
}

Assistant:

static CURLcode smtp_get_message(struct Curl_easy *data, struct bufref *out)
{
  char *message = Curl_dyn_ptr(&data->conn->proto.smtpc.pp.recvbuf);
  size_t len = data->conn->proto.smtpc.pp.nfinal;

  if(len > 4) {
    /* Find the start of the message */
    len -= 4;
    for(message += 4; *message == ' ' || *message == '\t'; message++, len--)
      ;

    /* Find the end of the message */
    while(len--)
      if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
         message[len] != '\t')
        break;

    /* Terminate the message */
    message[++len] = '\0';
    Curl_bufref_set(out, message, len, NULL);
  }
  else
    /* junk input => zero length output */
    Curl_bufref_set(out, "", 0, NULL);

  return CURLE_OK;
}